

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O0

void h2v1_merged_upsample_565D
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_group_ctr,
               JSAMPARRAY output_buf)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  jpeg_upsampler *pjVar6;
  JSAMPLE *pJVar7;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var8;
  long lVar9;
  _func_void_j_decompress_ptr *p_Var10;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  byte *pbVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  JSAMPROW inptr1;
  JSAMPROW inptr0;
  JSAMPROW outptr;
  int cr;
  int cb;
  int cblue;
  int cgreen;
  int cred;
  int y;
  my_merged_upsample_ptr upsample;
  JLONG rgb_1;
  uint b_1;
  uint g_1;
  uint r_1;
  JLONG d0_1;
  JLONG *Cbgtab_1;
  JLONG *Crgtab_1;
  int *Cbbtab_1;
  int *Crrtab_1;
  JSAMPLE *range_limit_1;
  JDIMENSION col_1;
  JSAMPROW inptr2_1;
  JSAMPROW inptr1_1;
  JSAMPROW inptr0_1;
  JSAMPROW outptr_1;
  int cr_1;
  int cb_1;
  int cblue_1;
  int cgreen_1;
  int cred_1;
  int y_1;
  my_merged_upsample_ptr upsample_1;
  ulong local_98;
  JSAMPARRAY output_buf_local;
  JDIMENSION in_row_group_ctr_local;
  JSAMPIMAGE input_buf_local;
  j_decompress_ptr cinfo_local;
  int test_value;
  JLONG rgb;
  byte *pbStack_50;
  uint b;
  uint g;
  uint r;
  JLONG d0;
  JLONG *Cbgtab;
  JLONG *Crgtab;
  int *Cbbtab;
  int *Crrtab;
  JSAMPLE *range_limit;
  JDIMENSION col;
  JSAMPROW inptr2;
  
  pjVar6 = cinfo->upsample;
  pJVar7 = cinfo->sample_range_limit;
  p_Var8 = pjVar6[1].upsample;
  lVar9 = *(long *)&pjVar6[1].need_context_rows;
  p_Var10 = pjVar6[2].start_pass;
  p_Var11 = pjVar6[2].upsample;
  local_98 = dither_matrix[cinfo->output_scanline & 3];
  pbStack_50 = (*input_buf)[in_row_group_ctr];
  _g = (ushort *)*output_buf;
  _test_value = input_buf[2][in_row_group_ctr];
  rgb = (JLONG)input_buf[1][in_row_group_ctr];
  for (cinfo_local._4_4_ = cinfo->output_width >> 1; cinfo_local._4_4_ != 0;
      cinfo_local._4_4_ = cinfo_local._4_4_ - 1) {
    iVar4 = *(int *)(p_Var8 + (long)(int)(uint)*_test_value * 4);
    iVar12 = (int)((ulong)(*(long *)(p_Var11 + (long)(int)(uint)*(byte *)rgb * 8) +
                          *(long *)(p_Var10 + (long)(int)(uint)*_test_value * 8)) >> 0x10);
    iVar5 = *(int *)(lVar9 + (long)(int)(uint)*(byte *)rgb * 4);
    pbVar15 = pbStack_50 + 1;
    uVar13 = (uint)*pbStack_50;
    uVar17 = local_98 & 0xff;
    uVar18 = local_98 & 0xff;
    uVar19 = local_98 & 0xff;
    uVar16 = (long)local_98 >> 8;
    pbStack_50 = pbStack_50 + 2;
    uVar14 = (uint)*pbVar15;
    bVar1 = pJVar7[(long)(int)(uVar14 + iVar4) + (uVar16 & 0xff)];
    bVar2 = pJVar7[(long)(int)(uVar14 + iVar12) + ((long)(uVar16 & 0xff) >> 1)];
    bVar3 = pJVar7[(long)(int)(uVar14 + iVar5) + (uVar16 & 0xff)];
    local_98 = (uVar16 & 0xff) << 0x18 | (long)((local_98 & 0xff) << 0x18 | uVar16 & 0xffffff) >> 8;
    *_g = (pJVar7[(long)(int)(uVar13 + iVar4) + uVar17] & 0xf8) << 8 |
          (pJVar7[(long)(int)(uVar13 + iVar12) + ((long)uVar18 >> 1)] & 0xfc) << 3 |
          (ushort)(pJVar7[(long)(int)(uVar13 + iVar5) + uVar19] >> 3);
    _g[1] = (bVar1 & 0xf8) << 8 | (bVar2 & 0xfc) << 3 | (ushort)(bVar3 >> 3);
    _g = _g + 2;
    _test_value = _test_value + 1;
    rgb = rgb + 1;
  }
  if ((cinfo->output_width & 1) != 0) {
    uVar13 = (uint)*pbStack_50;
    *_g = (pJVar7[(long)(int)(uVar13 + *(int *)(p_Var8 + (long)(int)(uint)*_test_value * 4)) +
                  (local_98 & 0xff)] & 0xf8) << 8 |
          (pJVar7[(long)(int)(uVar13 + (int)((ulong)(*(long *)(p_Var11 +
                                                              (long)(int)(uint)*(byte *)rgb * 8) +
                                                    *(long *)(p_Var10 +
                                                             (long)(int)(uint)*_test_value * 8)) >>
                                            0x10)) + ((long)(local_98 & 0xff) >> 1)] & 0xfc) << 3 |
          (ushort)(pJVar7[(long)(int)(uVar13 + *(int *)(lVar9 + (long)(int)(uint)*(byte *)rgb * 4))
                          + (local_98 & 0xff)] >> 3);
  }
  return;
}

Assistant:

METHODDEF(void)
h2v1_merged_upsample_565D(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                          JDIMENSION in_row_group_ctr, JSAMPARRAY output_buf)
{
  if (is_big_endian())
    h2v1_merged_upsample_565D_be(cinfo, input_buf, in_row_group_ctr,
                                 output_buf);
  else
    h2v1_merged_upsample_565D_le(cinfo, input_buf, in_row_group_ctr,
                                 output_buf);
}